

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__file.cc
# Opt level: O0

void __thiscall xemmai::io::t_file::t_file(t_file *this,wstring_view a_path,wstring_view a_mode)

{
  uint uVar1;
  char *__file;
  int *piVar2;
  t_file *ptVar3;
  wstring_view a_string;
  string local_60;
  anon_class_8_1_4c17f7ff local_40;
  int local_34;
  t_file *ptStack_30;
  int flags;
  t_file *this_local;
  wstring_view a_mode_local;
  wstring_view a_path_local;
  
  a_mode_local._M_len = (size_t)a_mode._M_str;
  ptVar3 = (t_file *)a_mode._M_len;
  a_string._M_len = a_path._M_str;
  a_mode_local._M_str = (wchar_t *)a_path._M_len;
  ptStack_30 = this;
  this_local = ptVar3;
  t_sharable::t_sharable(&this->super_t_sharable);
  this->v_own = true;
  local_40.a_mode = (wstring_view *)&this_local;
  local_34 = t_file::anon_class_8_1_4c17f7ff::operator()(&local_40);
  do {
    a_string._M_str = (wchar_t *)ptVar3;
    portable::f_convert_abi_cxx11_(&local_60,(portable *)a_mode_local._M_str,a_string);
    __file = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_60);
    uVar1 = open(__file,local_34,0x1ff);
    ptVar3 = (t_file *)(ulong)uVar1;
    this->v_fd = uVar1;
    std::__cxx11::string::~string((string *)&local_60);
    if (this->v_fd != -1) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  portable::f_throw_system_error();
}

Assistant:

t_file::t_file(std::wstring_view a_path, std::wstring_view a_mode) : v_own(true)
{
	auto flags = [&]
	{
		switch (a_mode.size()) {
		case 1:
			switch (a_mode[0]) {
			case L'r':
				return O_RDONLY;
			case L'w':
				return O_WRONLY | O_CREAT | O_TRUNC;
			case L'a':
				return O_WRONLY | O_CREAT | O_APPEND;
			}
		case 2:
			if (a_mode[1] == L'+')
				switch (a_mode[0]) {
				case L'r':
					return O_RDWR;
				case L'w':
					return O_RDWR | O_CREAT | O_TRUNC;
				case L'a':
					return O_RDWR | O_CREAT | O_APPEND;
				}
		}
		f_throw(L"invalid mode."sv);
	}();
	while (true) {
#ifdef _WIN32
		v_fd = open(portable::f_convert(a_path).c_str(), flags, S_IREAD | S_IWRITE);
#else
		v_fd = open(portable::f_convert(a_path).c_str(), flags, S_IRWXU | S_IRWXG | S_IRWXO);
#endif
		if (v_fd != -1) break;
		if (errno != EINTR) portable::f_throw_system_error();
	}
}